

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glesv2_gears.c
# Opt level: O2

void multiply(float *a,float *b)

{
  div_t dVar1;
  long lVar2;
  long lVar3;
  float fVar4;
  float m [16];
  
  for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 1) {
    dVar1 = div((int)lVar3,4);
    fVar4 = 0.0;
    for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 4) {
      fVar4 = fVar4 + a[((long)dVar1 >> 0x20) + lVar2] *
                      *(float *)((long)b + lVar2 + (long)(dVar1.quot * 4) * 4);
    }
    m[lVar3] = fVar4;
  }
  *(undefined8 *)(a + 0xc) = m._48_8_;
  *(undefined8 *)(a + 0xe) = m._56_8_;
  *(undefined8 *)(a + 8) = m._32_8_;
  *(undefined8 *)(a + 10) = m._40_8_;
  *(undefined8 *)(a + 4) = m._16_8_;
  *(undefined8 *)(a + 6) = m._24_8_;
  *(undefined8 *)a = m._0_8_;
  *(undefined8 *)(a + 2) = m._8_8_;
  return;
}

Assistant:

static void multiply(float *a, const float *b)
{
  float m[16];
  int i, j;
  div_t d;

  for (i = 0; i < 16; i++) {
    m[i] = 0;
    d = div(i, 4);
    for (j = 0; j < 4; j++)
      m[i] += (a + d.rem)[j * 4] * (b + d.quot * 4)[j];
  }

  memcpy(a, m, sizeof(m));
}